

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptArray::SetAccessors
          (JavascriptArray *this,PropertyId propertyId,Var getter,Var setter,
          PropertyOperationFlags flags)

{
  BOOL BVar1;
  int iVar2;
  DynamicTypeHandler *pDVar3;
  undefined4 extraout_var;
  uint32 local_44;
  ScriptContext *pSStack_40;
  uint32 index;
  ScriptContext *scriptContext;
  Var pvStack_30;
  PropertyOperationFlags flags_local;
  Var setter_local;
  Var getter_local;
  JavascriptArray *pJStack_18;
  PropertyId propertyId_local;
  JavascriptArray *this_local;
  
  scriptContext._4_4_ = flags;
  pvStack_30 = setter;
  setter_local = getter;
  getter_local._4_4_ = propertyId;
  pJStack_18 = this;
  pSStack_40 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  BVar1 = ScriptContext::IsNumericPropertyId(pSStack_40,getter_local._4_4_,&local_44);
  if (BVar1 == 0) {
    this_local._4_4_ =
         DynamicObject::SetAccessors
                   ((DynamicObject *)this,getter_local._4_4_,setter_local,pvStack_30,
                    scriptContext._4_4_);
  }
  else {
    pDVar3 = DynamicObject::GetTypeHandler((DynamicObject *)this);
    iVar2 = (*pDVar3->_vptr_DynamicTypeHandler[0x48])(pDVar3,this);
    this_local._4_4_ =
         (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x180))
                   ((long *)CONCAT44(extraout_var,iVar2),this,local_44,setter_local,pvStack_30);
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptArray::SetAccessors(PropertyId propertyId, Var getter, Var setter, PropertyOperationFlags flags)
    {
        ScriptContext* scriptContext = this->GetScriptContext();

        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            return GetTypeHandler()->ConvertToTypeWithItemAttributes(this)
                ->SetItemAccessors(this, index, getter, setter);
        }

        return __super::SetAccessors(propertyId, getter, setter, flags);
    }